

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenEnumDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  EnumDef *this_00;
  EnumVal *ev;
  string constant;
  string sStack_58;
  string local_38;
  
  this_00 = (field->value).type.enum_def;
  if (this_00 != (EnumDef *)0x0) {
    BVar1 = (field->value).type.base_type;
    if ((BVar1 == BASE_TYPE_VECTOR64) || (BVar1 == BASE_TYPE_VECTOR)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"0",(allocator<char> *)&sStack_58);
    }
    else {
      std::__cxx11::string::string((string *)&local_38,(string *)&(field->value).constant);
    }
    ev = EnumDef::FindByValue(this_00,&local_38);
    if (ev == (EnumVal *)0x0) {
      IdlNamer::LegacySwiftVariant_abi_cxx11_
                (&sStack_58,&this->namer_,
                 *(this_00->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      std::operator+(__return_storage_ptr__,".",&sStack_58);
    }
    else {
      IdlNamer::LegacySwiftVariant_abi_cxx11_(&sStack_58,&this->namer_,ev);
      std::operator+(__return_storage_ptr__,".",&sStack_58);
    }
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  }
  __assert_fail("value.type.enum_def",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_swift.cpp"
                ,0x726,
                "std::string flatbuffers::swift::SwiftGenerator::GenEnumDefaultValue(const FieldDef &)"
               );
}

Assistant:

std::string GenEnumDefaultValue(const FieldDef &field) {
    const auto &value = field.value;
    FLATBUFFERS_ASSERT(value.type.enum_def);
    const auto &enum_def = *value.type.enum_def;
    // Vector of enum defaults are always "[]" which never works.
    const std::string constant = IsVector(value.type) ? "0" : value.constant;
    const auto enum_val = enum_def.FindByValue(constant);
    if (enum_val) {
      return "." + namer_.LegacySwiftVariant(*enum_val);
    } else {
      const auto &ev = **enum_def.Vals().begin();
      return "." + namer_.LegacySwiftVariant(ev);
    }
  }